

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,EventTriggerStatement *stmt)

{
  if (stmt->timing != (TimingControl *)0x0) {
    handleTiming(this,stmt->timing);
  }
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::visitStmt
            (&this->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
             ,stmt);
  return;
}

Assistant:

void DataFlowAnalysis::handle(const EventTriggerStatement& stmt) {
    if (stmt.timing)
        handleTiming(*stmt.timing);
    visitStmt(stmt);
}